

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
mprpc::MpRpcClient::asnyc_call_abi_cxx11_
          (MpRpcClient *this,char *method,char *params,size_t params_size,int timeout_ms)

{
  int *piVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  MpRpcClient *this_00;
  char *pcVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  msgpack_sbuffer *sbuf;
  undefined4 in_register_00000084;
  undefined4 in_R9D;
  MsgPackPacker pk;
  uchar d;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> msg;
  MsgPackPacker local_d8;
  char *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  int local_90;
  undefined4 uStack_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  MpRpcClient *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_d8.pk.data = &local_d8;
  LOCK();
  piVar1 = (int *)(method + 0x548);
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  local_d8.sb.size = 0;
  local_d8.sb.data = (char *)0x0;
  local_d8.sb.alloc = 0;
  local_d8.pk.callback = msgpack_sbuffer_write;
  local_60 = this;
  pcVar5 = (char *)malloc(0x2000);
  if (pcVar5 != (char *)0x0) {
    local_d8.sb.alloc = 0x2000;
    *pcVar5 = -0x7d;
    local_d8.sb.size = 1;
    local_d8.sb.data = pcVar5;
  }
  MsgPackPacker::pack_map_item(&local_d8,"id",iVar2 + 1);
  MsgPackPacker::pack_map_item(&local_d8,"method",params);
  local_a8 = (char *)CONCAT71(local_a8._1_7_,0xa6);
  (*local_d8.pk.callback)(local_d8.pk.data,(char *)&local_a8,1);
  (*local_d8.pk.callback)(local_d8.pk.data,"params",6);
  (*local_d8.pk.callback)
            (local_d8.pk.data,(char *)params_size,CONCAT44(in_register_00000084,timeout_ms));
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char*&,unsigned_long&>
            (&local_68,&local_70,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8,&local_d8.sb.data,(unsigned_long *)&local_d8);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015b7a0;
  p_Stack_a0 = this_01 + 1;
  *(undefined4 *)&this_01[1]._vptr__Sp_counted_base = 1;
  *(MessageLoop **)&this_01[1]._M_use_count = (MessageLoop *)(method + 0x10);
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[3]._M_use_count = 0;
  this_01[3]._M_weak_count = 0;
  this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[4]._M_use_count = 0;
  this_01[4]._M_weak_count = 0;
  this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[5]._M_use_count = 0;
  this_01[5]._M_weak_count = 0;
  this_01[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[6]._M_use_count = 0;
  this_01[6]._M_weak_count = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = 2;
  }
  local_88 = local_70;
  p_Stack_80 = local_68._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_a8 = method;
  local_98 = this_01;
  local_90 = iVar2 + 1;
  uStack_8c = in_R9D;
  local_58._M_unused._M_object = operator_new(0x30);
  p_Var4 = p_Stack_80;
  p_Var3 = local_98;
  *(char **)local_58._M_unused._0_8_ = local_a8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 8) =
       p_Stack_a0;
  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x10) = p_Var3
  ;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(ulong *)((long)local_58._M_unused._0_8_ + 0x18) = CONCAT44(uStack_8c,local_90);
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   ((long)local_58._M_unused._0_8_ + 0x20) = local_88;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x28) = p_Var4
  ;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:232:36)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:232:36)>
             ::_M_manager;
  loop::MessageLoop::post_task((MessageLoop *)(method + 0x10),(Closure *)&local_58);
  this_00 = local_60;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  loop::
  Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_future((Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  free(local_d8.sb.data);
  return (Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00;
}

Assistant:

Future<MpRpcMessage, pair<int, string>> MpRpcClient::asnyc_call(const char* method, const char* params, size_t params_size, int timeout_ms)
    {
        int callid = ++m_cur_callid;
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item("id", callid);
        pk.pack_map_item("method", method);
        pk.pack_map_item_obj("params", params, params_size);

        auto msg = make_shared<string>(pk.sb.data, pk.sb.size);
        auto prom = make_shared<AsyncCallPromise>(&this->m_msg_loop);

        this->msg_loop().post_task([this, prom, callid, timeout_ms, msg]() {
            m_conn->send(msg->data(), msg->size());
            m_on_rsp_map[callid] = OnRspHandler(prom, system_clock::now() + milliseconds(timeout_ms));
        });
        return prom->get_future();
    }